

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.h
# Opt level: O1

uint * gf_matr_mul_vector(uint **a,uint rows,uint cols,uint *v,uint len)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  uint **a_00;
  uint **ppuVar6;
  undefined4 extraout_var;
  uint cols_00;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  
  if (rows == len) {
    puVar5 = (uint *)calloc((ulong)rows,4);
    if (rows != 0) {
      uVar7 = 0;
      do {
        puVar5[uVar7] = 0;
        if (len != 0) {
          uVar10 = puVar5[uVar7];
          uVar11 = 0;
          do {
            uVar3 = 0;
            if (((ulong)a[uVar7][uVar11] != 0) && (v[uVar11] != 0)) {
              uVar3 = index_of[a[uVar7][uVar11]] + index_of[v[uVar11]];
              uVar2 = (index_of[v[uVar11]] - 0xff) + index_of[a[uVar7][uVar11]];
              if (uVar3 < 0xff) {
                uVar2 = uVar3;
              }
              uVar3 = alpha_of[uVar2];
            }
            uVar10 = uVar10 ^ uVar3;
            uVar11 = uVar11 + 1;
          } while (len != uVar11);
          puVar5[uVar7] = uVar10;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != rows);
    }
    return puVar5;
  }
  gf_matr_mul_vector_cold_1();
  if (rows == 2 || rows == cols_00) {
    uVar3 = gf_matr_det(a,rows,cols_00);
    a_00 = matrix_copy(a,rows,cols_00);
    ppuVar6 = matrix_new(rows,cols_00);
    puVar5 = a_00[1];
    uVar10 = **a_00;
    **a_00 = puVar5[1];
    puVar5[1] = uVar10;
    if (rows != 0) {
      uVar7 = 0;
      do {
        if (cols_00 != 0) {
          puVar5 = a_00[uVar7];
          puVar1 = ppuVar6[uVar7];
          uVar11 = 0;
          do {
            uVar9 = (ulong)puVar5[uVar11];
            if (uVar9 != 0 && uVar3 != 0) {
              iVar8 = index_of[uVar9] - index_of[uVar3];
              iVar4 = iVar8 + 0xff;
              if (-1 < iVar8) {
                iVar4 = iVar8;
              }
              uVar10 = alpha_of[iVar4];
            }
            else {
              uVar10 = -(uint)(uVar9 != 0);
            }
            puVar1[uVar11] = uVar10;
            uVar11 = uVar11 + 1;
          } while (cols_00 != uVar11);
        }
        uVar7 = uVar7 + 1;
        uVar10 = cols_00;
      } while (uVar7 != rows);
    }
    matrix_free(a_00,rows,uVar10);
    return (uint *)ppuVar6;
  }
  gf_matr_inv_cold_1();
  test_n = test_n + 1;
  iVar4 = printf("test %d failed\n");
  return (uint *)CONCAT71((int7)(CONCAT44(extraout_var,iVar4) >> 8),1);
}

Assistant:

uint32_t *gf_matr_mul_vector(uint32_t **a, uint32_t rows, uint32_t cols, uint32_t* v, uint32_t len){
    if(rows != len)
        fatal("gf_matr_mul_vector", "rows != vector rows\n");

    uint32_t *c = vector_new(rows);
    for (uint32_t i = 0; i < rows; i++)
        for (uint32_t j = 0; j < 1; j++)
        {
            c[i] = 0;
            for (uint32_t _k = 0; _k < len; _k++)
                c[i] = gf_sum(c[i], gf_mul(a[i][_k], v[_k]));
        }

    return c;
}